

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawCmd *__src;
  uint in_ESI;
  ImDrawListSharedData *in_RDI;
  ImDrawCmd cmd;
  ImDrawList *draw_list;
  ImRect viewport_rect;
  ImGuiViewportP *viewport;
  ImDrawCmd *in_stack_ffffffffffffff48;
  ImDrawList *this;
  float in_stack_ffffffffffffff58;
  float _x;
  ImVec2 *p_max;
  ImVec2 *this_00;
  ImDrawList *this_01;
  ImVec2 *in_stack_ffffffffffffff78;
  ImDrawList *in_stack_ffffffffffffff80;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [24];
  ImRect local_28;
  ImGuiViewport *local_18;
  ImDrawListSharedData *local_8;
  
  if ((in_ESI & 0xff000000) != 0) {
    local_8 = in_RDI;
    local_18 = GetMainViewport();
    local_28 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x4b6d26);
    local_40._16_8_ = *(long *)((long)local_8[1].ArcFastVtx[0x21] + 0x278);
    if ((float)(((ImDrawList *)local_40._16_8_)->CmdBuffer).Size == 0.0) {
      ImDrawList::AddDrawCmd(in_stack_ffffffffffffff80);
    }
    this = (ImDrawList *)local_40;
    _x = 1.0;
    this_01 = (ImDrawList *)local_40._16_8_;
    ImVec2::ImVec2((ImVec2 *)this,1.0,1.0);
    local_40._8_8_ = ::operator-((ImVec2 *)in_stack_ffffffffffffff48,(ImVec2 *)0x4b6daf);
    p_max = &local_28.Max;
    this_00 = &local_50;
    ImVec2::ImVec2(this_00,_x,_x);
    local_48 = ::operator+((ImVec2 *)in_stack_ffffffffffffff48,(ImVec2 *)0x4b6dec);
    ImDrawList::PushClipRect
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(ImVec2 *)this_01,
               SUB81((ulong)this_00 >> 0x38,0));
    ImDrawList::AddRectFilled
              (this_01,this_00,p_max,(ImU32)_x,in_stack_ffffffffffffff58,
               (ImDrawFlags)((ulong)this >> 0x20));
    __src = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)local_40._16_8_);
    memcpy(&stack0xffffffffffffff78,__src,0x38);
    ImVector<ImDrawCmd>::pop_back((ImVector<ImDrawCmd> *)local_40._16_8_);
    ImVector<ImDrawCmd>::push_front(&this->CmdBuffer,in_stack_ffffffffffffff48);
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}